

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_Error tt_cmap2_validate(FT_Byte *table,FT_Validator valid)

{
  FT_Byte *pFVar1;
  FT_Byte FVar2;
  byte bVar3;
  FT_Byte FVar4;
  FT_Byte FVar5;
  FT_Byte FVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  FT_Byte *pFVar10;
  FT_Byte *pFVar11;
  FT_Byte *pFVar12;
  FT_UInt idx_1;
  FT_Byte *limit;
  FT_Byte *ids;
  FT_Int delta;
  FT_UInt offset;
  FT_UInt code_count;
  FT_UInt first_code;
  FT_UInt idx;
  FT_Byte *glyph_ids;
  FT_Byte *subs;
  FT_Byte *keys;
  uint local_28;
  FT_UInt max_subs;
  FT_UInt n;
  FT_UInt length;
  FT_Byte *p;
  FT_Validator valid_local;
  FT_Byte *table_local;
  
  if (valid->limit < table + 4) {
    ft_validator_error(valid,8);
  }
  uVar8 = (uint)CONCAT11(table[2],table[3]);
  if ((valid->limit < table + uVar8) || (uVar8 < 0x206)) {
    ft_validator_error(valid,8);
  }
  keys._4_4_ = 0;
  _n = table + 6;
  for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
    FVar2 = *_n;
    bVar3 = _n[1];
    if ((FT_VALIDATE_TIGHT < valid->level) && ((bVar3 & 7) != 0)) {
      ft_validator_error(valid,8);
    }
    uVar9 = (uint)(ushort)(CONCAT11(FVar2,bVar3) >> 3);
    if (keys._4_4_ < uVar9) {
      keys._4_4_ = uVar9;
    }
    _n = _n + 2;
  }
  pFVar10 = _n + (keys._4_4_ + 1) * 8;
  if (valid->limit < pFVar10) {
    ft_validator_error(valid,8);
  }
  for (local_28 = 0; local_28 <= keys._4_4_; local_28 = local_28 + 1) {
    uVar7 = CONCAT11(_n[2],_n[3]);
    FVar2 = _n[4];
    FVar4 = _n[5];
    pFVar11 = _n + 8;
    FVar5 = _n[6];
    FVar6 = _n[7];
    pFVar1 = pFVar11;
    if (uVar7 != 0) {
      if ((FT_VALIDATE_TIGHT < valid->level) &&
         ((0xff < CONCAT11(*_n,_n[1]) || (0x100 - CONCAT11(*_n,_n[1]) < (uint)uVar7)))) {
        ft_validator_error(valid,8);
      }
      if (CONCAT11(FVar5,FVar6) != 0) {
        if ((_n + (ulong)(uint)CONCAT11(FVar5,FVar6) + 6 < pFVar10) ||
           (table + uVar8 < _n + (ulong)(uint)CONCAT11(FVar5,FVar6) + 6 + (ulong)uVar7 * 2)) {
          ft_validator_error(valid,9);
        }
        if (valid->level != FT_VALIDATE_DEFAULT) {
          _n = pFVar11;
          while (pFVar1 = _n, _n < pFVar11 + (ulong)uVar7 * 2) {
            pFVar12 = _n + 2;
            FVar5 = *_n;
            pFVar1 = _n + 1;
            _n = pFVar12;
            if ((CONCAT11(FVar5,*pFVar1) != 0) &&
               ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <=
                (uint)(ushort)(CONCAT11(FVar5,*pFVar1) + CONCAT11(FVar2,FVar4)))) {
              ft_validator_error(valid,0x10);
            }
          }
        }
      }
    }
    _n = pFVar1;
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap2_validate( FT_Byte*      table,
                     FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_UInt   length;

    FT_UInt   n, max_subs;
    FT_Byte*  keys;        /* keys table     */
    FT_Byte*  subs;        /* sub-headers    */
    FT_Byte*  glyph_ids;   /* glyph ID array */


    if ( table + 2 + 2 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p      = table + 2;           /* skip format */
    length = TT_NEXT_USHORT( p );

    if ( table + length > valid->limit || length < 6 + 512 )
      FT_INVALID_TOO_SHORT;

    keys = table + 6;

    /* parse keys to compute sub-headers count */
    p        = keys;
    max_subs = 0;
    for ( n = 0; n < 256; n++ )
    {
      FT_UInt  idx = TT_NEXT_USHORT( p );


      /* value must be multiple of 8 */
      if ( valid->level >= FT_VALIDATE_PARANOID && ( idx & 7 ) != 0 )
        FT_INVALID_DATA;

      idx >>= 3;

      if ( idx > max_subs )
        max_subs = idx;
    }

    FT_ASSERT( p == table + 518 );

    subs      = p;
    glyph_ids = subs + ( max_subs + 1 ) * 8;
    if ( glyph_ids > valid->limit )
      FT_INVALID_TOO_SHORT;

    /* parse sub-headers */
    for ( n = 0; n <= max_subs; n++ )
    {
      FT_UInt  first_code, code_count, offset;
      FT_Int   delta;


      first_code = TT_NEXT_USHORT( p );
      code_count = TT_NEXT_USHORT( p );
      delta      = TT_NEXT_SHORT( p );
      offset     = TT_NEXT_USHORT( p );

      /* many Dynalab fonts have empty sub-headers */
      if ( code_count == 0 )
        continue;

      /* check range within 0..255 */
      if ( valid->level >= FT_VALIDATE_PARANOID )
      {
        if ( first_code >= 256 || code_count > 256 - first_code )
          FT_INVALID_DATA;
      }

      /* check offset */
      if ( offset != 0 )
      {
        FT_Byte*  ids;


        ids = p - 2 + offset;
        if ( ids < glyph_ids || ids + code_count * 2 > table + length )
          FT_INVALID_OFFSET;

        /* check glyph IDs */
        if ( valid->level >= FT_VALIDATE_TIGHT )
        {
          FT_Byte*  limit = p + code_count * 2;
          FT_UInt   idx;


          for ( ; p < limit; )
          {
            idx = TT_NEXT_USHORT( p );
            if ( idx != 0 )
            {
              idx = (FT_UInt)( (FT_Int)idx + delta ) & 0xFFFFU;
              if ( idx >= TT_VALID_GLYPH_COUNT( valid ) )
                FT_INVALID_GLYPH_ID;
            }
          }
        }
      }
    }

    return FT_Err_Ok;
  }